

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChHexahedronFace.h
# Opt level: O1

void __thiscall
chrono::fea::ChHexahedronFace::ComputeNF
          (ChHexahedronFace *this,double U,double V,ChVectorDynamic<> *Qi,double *detJ,
          ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  element_type *peVar7;
  double *pdVar8;
  long lVar9;
  double *pdVar10;
  long lVar11;
  char *__function;
  int i;
  long lVar12;
  double *pdVar13;
  Index index;
  ulong uVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ChVectorN<double,_4> N;
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  element_type *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  double local_70;
  double local_68;
  
  local_68 = (1.0 - U) * 0.25;
  local_80 = (element_type *)(local_68 * (1.0 - V));
  local_70 = (U + 1.0) * 0.25;
  local_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_70 * (1.0 - V));
  local_70 = local_70 * (V + 1.0);
  local_68 = local_68 * (V + 1.0);
  i = (int)this;
  GetNodeN((ChHexahedronFace *)local_90,i);
  GetNodeN((ChHexahedronFace *)local_b0,i);
  dVar16 = *(double *)(local_90._0_8_ + 0x20);
  dVar17 = *(double *)(local_90._0_8_ + 0x28);
  dVar2 = *(double *)(local_b0._0_8_ + 0x20);
  dVar3 = *(double *)(local_b0._0_8_ + 0x28);
  dVar4 = *(double *)(local_90._0_8_ + 0x30);
  dVar5 = *(double *)(local_b0._0_8_ + 0x30);
  GetNodeN((ChHexahedronFace *)local_c0,i);
  GetNodeN((ChHexahedronFace *)local_d0,i);
  dVar17 = (dVar17 - dVar3) -
           (*(double *)(local_c0._0_8_ + 0x28) - *(double *)(local_d0._0_8_ + 0x28));
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar17 * dVar17;
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       (dVar16 - dVar2) - (*(double *)(local_c0._0_8_ + 0x20) - *(double *)(local_d0._0_8_ + 0x20));
  auVar18 = vfmadd231sd_fma(auVar18,auVar22,auVar22);
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (dVar4 - dVar5) - (*(double *)(local_c0._0_8_ + 0x30) - *(double *)(local_d0._0_8_ + 0x30));
  auVar18 = vfmadd231sd_fma(auVar18,auVar20,auVar20);
  if (auVar18._0_8_ < 0.0) {
    dVar16 = sqrt(auVar18._0_8_);
  }
  else {
    auVar18 = vsqrtsd_avx(auVar18,auVar18);
    dVar16 = auVar18._0_8_;
  }
  GetNodeN((ChHexahedronFace *)local_e0,i);
  GetNodeN((ChHexahedronFace *)local_f0,i);
  dVar17 = *(double *)(local_e0._0_8_ + 0x20);
  dVar2 = *(double *)(local_e0._0_8_ + 0x28);
  dVar3 = *(double *)(local_f0._0_8_ + 0x20);
  dVar4 = *(double *)(local_f0._0_8_ + 0x28);
  dVar5 = *(double *)(local_e0._0_8_ + 0x30);
  dVar6 = *(double *)(local_f0._0_8_ + 0x30);
  GetNodeN((ChHexahedronFace *)local_100,i);
  GetNodeN((ChHexahedronFace *)local_a0,i);
  dVar2 = (dVar2 - dVar4) -
          (*(double *)(local_100._0_8_ + 0x28) -
          (double)((element_type *)(local_a0._0_8_ + 0x28))->_vptr_ChElementHexahedron);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar2 * dVar2;
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       (dVar17 - dVar3) -
       (*(double *)(local_100._0_8_ + 0x20) -
       (double)((element_type *)(local_a0._0_8_ + 0x20))->_vptr_ChElementHexahedron);
  auVar18 = vfmadd231sd_fma(auVar19,auVar23,auVar23);
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (dVar5 - dVar6) -
       (*(double *)(local_100._0_8_ + 0x30) -
       (double)((element_type *)(local_a0._0_8_ + 0x30))->_vptr_ChElementHexahedron);
  auVar18 = vfmadd231sd_fma(auVar18,auVar21,auVar21);
  if (auVar18._0_8_ < 0.0) {
    dVar17 = sqrt(auVar18._0_8_);
  }
  else {
    auVar18 = vsqrtsd_avx(auVar18,auVar18);
    dVar17 = auVar18._0_8_;
  }
  *detJ = dVar17 * dVar16;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
  }
  pdVar8 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  lVar9 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  pdVar10 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  lVar11 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  lVar12 = 0;
  pdVar13 = pdVar10;
  do {
    if (lVar9 < 3) {
      __function = 
      "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
      ;
LAB_00647196:
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
    }
    if (lVar11 + -3 < lVar12 * 3) {
      __function = 
      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
      ;
      goto LAB_00647196;
    }
    pdVar1 = pdVar10 + lVar12 * 3;
    uVar14 = 3;
    if ((((ulong)pdVar1 & 7) == 0) &&
       (uVar14 = (ulong)(-((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7), 2 < uVar14)) {
      uVar14 = 3;
    }
    peVar7 = (&local_80)[lVar12];
    if (uVar14 != 0) {
      uVar15 = 0;
      do {
        pdVar13[uVar15] = (double)peVar7 * pdVar8[uVar15];
        uVar15 = uVar15 + 1;
      } while (uVar14 != uVar15);
    }
    if (uVar14 < 3) {
      do {
        pdVar13[uVar14] = (double)peVar7 * pdVar8[uVar14];
        uVar14 = uVar14 + 1;
      } while (uVar14 != 3);
    }
    lVar12 = lVar12 + 1;
    pdVar13 = pdVar13 + 3;
    if (lVar12 == 4) {
      return;
    }
  } while( true );
}

Assistant:

virtual void ComputeNF(const double U,              ///< parametric coordinate in surface
                           const double V,              ///< parametric coordinate in surface
                           ChVectorDynamic<>& Qi,       ///< result of N'*F, maybe with offset block_offset
                           double& detJ,                ///< det[J]
                           const ChVectorDynamic<>& F,  ///< Input F vector, size is = n.field coords.
                           ChVectorDynamic<>* state_x,  ///< if != 0, update state (pos. part) to this, then evaluate Q
                           ChVectorDynamic<>* state_w   ///< if != 0, update state (speed part) to this, then evaluate Q
                           ) override {
        ChVectorN<double, 4> N;
        ShapeFunctions(N, U, V);

        //***TODO*** exact det of jacobian at u,v
        detJ = ((GetNodeN(0)->GetPos() - GetNodeN(1)->GetPos()) - (GetNodeN(2)->GetPos() - GetNodeN(3)->GetPos()))
                   .Length() *
               ((GetNodeN(1)->GetPos() - GetNodeN(2)->GetPos()) - (GetNodeN(3)->GetPos() - GetNodeN(0)->GetPos()))
                   .Length();
        // (approximate detJ, ok only for rectangular face)

        for (int i = 0; i < 4; i++) {
            Qi.segment(3 * i, 3) = N(i) * F.segment(0, 3);
        }
    }